

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int lua_checkstack(lua_State *L,int size)

{
  int iVar1;
  int newsize;
  StkId pTVar2;
  int iVar3;
  
  iVar3 = 0;
  if (size < 0x1f41) {
    pTVar2 = L->top;
    iVar3 = 0;
    if ((((long)pTVar2 - (long)L->base >> 4) + (long)size < 0x1f41) && (iVar3 = 1, 0 < size)) {
      if ((long)L->stack_last - (long)pTVar2 <= (long)(ulong)(uint)(size << 4)) {
        iVar1 = L->stacksize;
        newsize = iVar1 * 2;
        if (iVar1 < size) {
          newsize = iVar1 + size;
        }
        luaD_reallocstack(L,newsize);
        pTVar2 = L->top;
      }
      if (L->ci->top < pTVar2 + size) {
        L->ci->top = pTVar2 + size;
      }
    }
  }
  return iVar3;
}

Assistant:

static int lua_checkstack(lua_State*L,int size){
int res=1;
if(size>8000||(L->top-L->base+size)>8000)
res=0;
else if(size>0){
luaD_checkstack(L,size);
if(L->ci->top<L->top+size)
L->ci->top=L->top+size;
}
return res;
}